

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gc.cpp
# Opt level: O2

void __thiscall Gc_StartAndKill_Test::~Gc_StartAndKill_Test(Gc_StartAndKill_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (Gc, StartAndKill) {
    constexpr auto path = "path0";
    auto call0 = call_params (0);

    test_watch_thread gc;
    expect_call (gc, call0);

    std::thread thread{[&gc] () { gc.watcher (); }};
    gc.start_vacuum (path);
    EXPECT_EQ (gc.size (), 1U);
    gc.stop_vacuum (path);
    EXPECT_EQ (gc.size (), 0U);
    gc.stop_vacuum (path);
    EXPECT_EQ (gc.size (), 0U);
    gc.stop ();
    thread.join ();
}